

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O1

void fdb_fetch_header(uint64_t version,void *header_buf,bid_t *trie_root_bid,bid_t *seq_root_bid,
                     bid_t *stale_root_bid,uint64_t *ndocs,uint64_t *ndeletes,uint64_t *nlivenodes,
                     uint64_t *datasize,uint64_t *last_wal_flush_hdr_bid,uint64_t *kv_info_offset,
                     uint64_t *header_flags,char **new_filename,char **old_filename)

{
  ushort uVar1;
  ushort uVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  ulong *puVar6;
  long lVar7;
  
  uVar4 = *header_buf;
  *trie_root_bid =
       uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
       (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
       (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  uVar4 = *(ulong *)((long)header_buf + 8);
  *seq_root_bid =
       uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
       (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
       (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  bVar3 = ver_staletree_support(version);
  if (bVar3) {
    uVar4 = *(ulong *)((long)header_buf + 0x10);
    *stale_root_bid = uVar4;
    uVar4 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
            (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
            (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
    lVar7 = 0x18;
  }
  else {
    lVar7 = 0x10;
    uVar4 = 0xffffffffffffffff;
  }
  *stale_root_bid = uVar4;
  uVar4 = *(ulong *)((long)header_buf + lVar7);
  *ndocs = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
           (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
           (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  bVar3 = ver_is_atleast_magic_001(version);
  if (bVar3) {
    uVar4 = *(ulong *)((long)header_buf + lVar7 + 8);
    *ndeletes = uVar4;
    lVar7 = lVar7 + 0x10;
    uVar4 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
            (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
            (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  }
  else {
    lVar7 = lVar7 + 8;
    uVar4 = 0;
  }
  *ndeletes = uVar4;
  puVar6 = (ulong *)((long)header_buf + lVar7);
  uVar4 = *puVar6;
  *nlivenodes = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 |
                uVar4 << 0x38;
  uVar4 = puVar6[1];
  *datasize = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18
              | (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18
              | (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  uVar4 = puVar6[2];
  *last_wal_flush_hdr_bid =
       uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
       (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
       (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  uVar4 = puVar6[3];
  *kv_info_offset =
       uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
       (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
       (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  uVar4 = puVar6[4];
  *header_flags =
       uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
       (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
       (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  uVar1 = (ushort)puVar6[5];
  uVar2 = *(ushort *)((long)puVar6 + 0x2a);
  pcVar5 = (char *)0x0;
  if (uVar1 != 0) {
    pcVar5 = (char *)((long)puVar6 + 0x2c);
  }
  *new_filename = pcVar5;
  if ((old_filename != (char **)0x0) && (uVar2 != 0)) {
    uVar4 = (ulong)(ushort)(uVar2 << 8 | uVar2 >> 8);
    pcVar5 = (char *)malloc(uVar4);
    *old_filename = pcVar5;
    memcpy(pcVar5,(char *)((long)puVar6 + 0x2c) + (ushort)(uVar1 << 8 | uVar1 >> 8),uVar4);
    return;
  }
  return;
}

Assistant:

void fdb_fetch_header(uint64_t version,
                      void *header_buf,
                      bid_t *trie_root_bid,
                      bid_t *seq_root_bid,
                      bid_t *stale_root_bid,
                      uint64_t *ndocs,
                      uint64_t *ndeletes,
                      uint64_t *nlivenodes,
                      uint64_t *datasize,
                      uint64_t *last_wal_flush_hdr_bid,
                      uint64_t *kv_info_offset,
                      uint64_t *header_flags,
                      char **new_filename,
                      char **old_filename)
{
    size_t offset = 0;
    uint16_t new_filename_len;
    uint16_t old_filename_len;

    seq_memcpy(trie_root_bid, (uint8_t *)header_buf + offset,
               sizeof(bid_t), offset);
    *trie_root_bid = _endian_decode(*trie_root_bid);

    seq_memcpy(seq_root_bid, (uint8_t *)header_buf + offset,
               sizeof(bid_t), offset);
    *seq_root_bid = _endian_decode(*seq_root_bid);

    if (ver_staletree_support(version)) {
        seq_memcpy(stale_root_bid, (uint8_t *)header_buf + offset,
                   sizeof(bid_t), offset);
        *stale_root_bid = _endian_decode(*stale_root_bid);
    } else {
        *stale_root_bid = BLK_NOT_FOUND;
    }

    seq_memcpy(ndocs, (uint8_t *)header_buf + offset,
               sizeof(uint64_t), offset);
    *ndocs = _endian_decode(*ndocs);
    if (ver_is_atleast_magic_001(version)) {
        seq_memcpy(ndeletes, (uint8_t *)header_buf + offset,
                   sizeof(uint64_t), offset);
        *ndeletes = _endian_decode(*ndeletes);
    } else {
        *ndeletes = 0;
    }

    seq_memcpy(nlivenodes, (uint8_t *)header_buf + offset,
               sizeof(uint64_t), offset);
    *nlivenodes = _endian_decode(*nlivenodes);

    seq_memcpy(datasize, (uint8_t *)header_buf + offset,
               sizeof(uint64_t), offset);
    *datasize = _endian_decode(*datasize);

    seq_memcpy(last_wal_flush_hdr_bid, (uint8_t *)header_buf + offset,
               sizeof(uint64_t), offset);
    *last_wal_flush_hdr_bid = _endian_decode(*last_wal_flush_hdr_bid);

    seq_memcpy(kv_info_offset, (uint8_t *)header_buf + offset,
               sizeof(uint64_t), offset);
    *kv_info_offset = _endian_decode(*kv_info_offset);

    seq_memcpy(header_flags, (uint8_t *)header_buf + offset,
               sizeof(uint64_t), offset);
    *header_flags = _endian_decode(*header_flags);

    seq_memcpy(&new_filename_len, (uint8_t *)header_buf + offset,
               sizeof(new_filename_len), offset);
    new_filename_len = _endian_decode(new_filename_len);
    seq_memcpy(&old_filename_len, (uint8_t *)header_buf + offset,
               sizeof(old_filename_len), offset);
    old_filename_len = _endian_decode(old_filename_len);
    if (new_filename_len) {
        *new_filename = (char*)((uint8_t *)header_buf + offset);
    } else {
        *new_filename = NULL;
    }
    offset += new_filename_len;
    if (old_filename && old_filename_len) {
        *old_filename = (char *) malloc(old_filename_len);
        seq_memcpy(*old_filename,
                   (uint8_t *)header_buf + offset,
                   old_filename_len, offset);
    }
}